

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

bool_t rngTestFIPS4(octet *buf)

{
  size_t i;
  size_t l;
  octet b;
  octet *buf_local;
  
  b = *buf & 1;
  l = 1;
  i = 1;
  do {
    if (19999 < i) {
      return (uint)(l < 0x1a);
    }
    if (((int)(uint)buf[i >> 3] >> ((byte)i & 7) & 1U) == (uint)b) {
      l = l + 1;
    }
    else {
      if (0x19 < l) {
        return 0;
      }
      b = b == '\0';
      l = 1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

bool_t rngTestFIPS4(const octet buf[2500])
{
	octet b;
	size_t l;
	size_t i;
	ASSERT(memIsValid(buf, 2500));
	b = buf[0] & 1;
	l = 1;
	for (i = 1; i < 20000; ++i)
		if ((buf[i / 8] >> i % 8 & 1) == b)
			++l;
		else
		{
			if (l >= 26)
				return FALSE;
			b = !b, l = 1;
		}
	return l < 26;
}